

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

int spectest::LaneCountFromType(Type type)

{
  if (0xfffffff8 < (uint)type.enum_) {
    if ((0x7bU >> (type.enum_ + I32U & 0x1fU) & 1) != 0) {
      return *(int *)(&DAT_001e1280 + (long)(type.enum_ + I32U) * 4);
    }
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc"
                ,0xb7,"int spectest::LaneCountFromType(Type)");
}

Assistant:

int LaneCountFromType(Type type) {
  switch (type) {
    case Type::I8: return 16;
    case Type::I16: return 8;
    case Type::I32: return 4;
    case Type::I64: return 2;
    case Type::F32: return 4;
    case Type::F64: return 2;
    default: assert(false); return 0;
  }
}